

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

bool __thiscall wasm::Literal::isArithmeticNaN(Literal *this)

{
  bool bVar1;
  uintptr_t uVar2;
  float f;
  double f_00;
  
  bVar1 = isNaN(this);
  if (bVar1) {
    uVar2 = (this->type).id;
    if (uVar2 == 4) {
      f = getf32(this);
      NaNPayload(f);
      uVar2 = (this->type).id;
    }
    if (uVar2 == 5) {
      f_00 = getf64(this);
      NaNPayload(f_00);
    }
  }
  return false;
}

Assistant:

bool Literal::isArithmeticNaN() {
  if (!isNaN()) {
    return false;
  }
  return (type == Type::f32 && NaNPayload(getf32()) > (1u << 23) - 1) ||
         (type == Type::f64 && NaNPayload(getf64()) > (1ull << 52) - 1);
}